

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panel_code.cpp
# Opt level: O0

int panel_item_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  int n;
  Am_Value fw;
  Am_Object local_20;
  Am_Object owner;
  Am_Object *self_local;
  
  owner.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)&n);
    pAVar3 = Am_Object::Peek(&local_20,0x99,0);
    Am_Value::operator=((Am_Value *)&n,pAVar3);
    if ((short)n == 4) {
      bVar1 = Am_Value::operator_cast_to_bool((Am_Value *)&n);
      if (bVar1) {
        pAVar3 = Am_Object::Get(&local_20,0x6e,0);
        self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar3);
      }
      else {
        pAVar3 = Am_Object::Get((Am_Object *)owner.data,0x1d0,0);
        self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar3);
      }
    }
    else if ((short)n == 2) {
      iVar2 = Am_Value::operator_cast_to_int((Am_Value *)&n);
      if (iVar2 == 0) {
        pAVar3 = Am_Object::Get((Am_Object *)owner.data,0x1d0,0);
        self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar3);
      }
      else if (iVar2 == 1) {
        pAVar3 = Am_Object::Get(&local_20,0x6e,0);
        self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar3);
      }
      else {
        pAVar3 = Am_Object::Get((Am_Object *)owner.data,0x99,0);
        self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar3);
      }
    }
    else {
      Am_Error("Am_Panel_Item_Width: wrong type for Am_FIXED_WIDTH slot.",(Am_Object *)owner.data,
               0x99);
      self_local._4_4_ = 0;
    }
    Am_Value::~Am_Value((Am_Value *)&n);
  }
  else {
    pAVar3 = Am_Object::Get((Am_Object *)owner.data,0x1d0,0);
    self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar3);
  }
  Am_Object::~Am_Object(&local_20);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, panel_item_width)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    Am_Value fw;
    fw = owner.Peek(Am_FIXED_WIDTH);
    if (fw.type == Am_BOOL) {
      if ((bool)fw)
        return owner.Get(Am_MAX_WIDTH);
      else
        return self.Get(Am_REAL_WIDTH);
    } else // not Am_BOOL
        if (fw.type == Am_INT) {
      int n = fw;
      if (n == 0)
        return self.Get(Am_REAL_WIDTH);
      if (n == 1)
        return owner.Get(Am_MAX_WIDTH);
      return self.Get(Am_FIXED_WIDTH);
    }
    //    else if (!fw.Exists())
    //  return 0;
    else { // neither int nor bool: error.
      Am_Error("Am_Panel_Item_Width: wrong type for Am_FIXED_WIDTH slot.", self,
               Am_FIXED_WIDTH);
      return 0;
    }
  } else
    return self.Get(Am_REAL_WIDTH);
}